

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covInt.h
# Opt level: O0

int Min_CubesDistTwo(Min_Cube_t *pCube0,Min_Cube_t *pCube1,int *pVar0,int *pVar1)

{
  uint uVar1;
  int local_44;
  int local_40;
  int Var1;
  int Var0;
  int k;
  int i;
  uint uData;
  int *pVar1_local;
  int *pVar0_local;
  Min_Cube_t *pCube1_local;
  Min_Cube_t *pCube0_local;
  
  local_40 = -1;
  local_44 = -1;
  Var0 = 0;
  do {
    if ((int)(*(uint *)&pCube0->field_0x8 >> 10 & 0xfff) <= Var0) {
      if ((local_40 < 0) || (local_44 < 0)) {
        if ((local_40 == -1) || (local_44 == -1)) {
          printf("\n");
          Min_CubeWrite(_stdout,pCube0);
          Min_CubeWrite(_stdout,pCube1);
          printf("Error: Min_CubesDistTwo() looks at two equal cubes or dist1 cubes!\n");
        }
        pCube0_local._4_4_ = 0;
      }
      else {
        *pVar0 = local_40;
        *pVar1 = local_44;
        pCube0_local._4_4_ = 1;
      }
      return pCube0_local._4_4_;
    }
    uVar1 = pCube0->uData[Var0] ^ pCube1->uData[Var0];
    if (uVar1 != 0) {
      if ((-1 < local_40) && (-1 < local_44)) {
        return 0;
      }
      uVar1 = (uVar1 | uVar1 >> 1) & 0x55555555;
      if (((-1 < local_40) || (-1 < local_44)) && ((uVar1 & uVar1 - 1) != 0)) {
        return 0;
      }
      for (Var1 = 0; Var1 < 0x20; Var1 = Var1 + 2) {
        if ((uVar1 & 1 << ((byte)Var1 & 0x1f)) != 0) {
          if (local_40 == -1) {
            local_40 = Var0 * 0x10 + Var1 / 2;
          }
          else {
            if (local_44 != -1) {
              return 0;
            }
            local_44 = Var0 * 0x10 + Var1 / 2;
          }
        }
      }
    }
    Var0 = Var0 + 1;
  } while( true );
}

Assistant:

static inline int Min_CubesDistTwo( Min_Cube_t * pCube0, Min_Cube_t * pCube1, int * pVar0, int * pVar1 )
{
    unsigned uData;//, uData2;
    int i, k, Var0 = -1, Var1 = -1;
    for ( i = 0; i < (int)pCube0->nWords; i++ )
    {
        uData = pCube0->uData[i] ^ pCube1->uData[i];
        if ( uData == 0 )
            continue;
        if ( Var0 >= 0 && Var1 >= 0 ) // more than two 1s
            return 0;
        uData = (uData | (uData >> 1)) & 0x55555555;
        if ( (Var0 >= 0 || Var1 >= 0) && (uData & (uData-1)) > 0 )
            return 0;
        for ( k = 0; k < 32; k += 2 )
            if ( uData & (1 << k) )
            {
                if ( Var0 == -1 )
                    Var0 = 16 * i + k/2;
                else if ( Var1 == -1 )
                    Var1 = 16 * i + k/2;
                else
                    return 0;
            }
        /*
        if ( Var0 >= 0 )
        {
            uData &= 0xFFFF;
            uData2 = (uData >> 16);
            if ( uData && uData2 )
                return 0;
            if ( uData )
            {
            }
            uData }= uData2;
            uData &= 0x
        }
        */
    }
    if ( Var0 >= 0 && Var1 >= 0 )
    {
        *pVar0 = Var0;
        *pVar1 = Var1;
        return 1;
    }
    if ( Var0 == -1 || Var1 == -1 )
    {
        printf( "\n" );
        Min_CubeWrite( stdout, pCube0 );
        Min_CubeWrite( stdout, pCube1 );
        printf( "Error: Min_CubesDistTwo() looks at two equal cubes or dist1 cubes!\n" );
    }
    return 0;
}